

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

bool __thiscall
cmOutputConverter::Shell_ArgumentNeedsQuotes(cmOutputConverter *this,string_view in,int flags)

{
  char cVar1;
  bool bVar2;
  const_iterator end;
  size_type sVar3;
  const_reference pvVar4;
  char c;
  iterator cend;
  iterator cit;
  undefined1 auStack_20 [4];
  int flags_local;
  string_view in_local;
  
  in_local._M_len = in._M_len;
  _auStack_20 = this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (bVar2) {
    in_local._M_str._7_1_ = true;
  }
  else {
    cend = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    end = std::basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    while ((cend != end &&
           ((((undefined1  [16])in & (undefined1  [16])0x40) == (undefined1  [16])0x0 ||
            (cend = Shell_SkipMakeVariables(cend,end), cend != end))))) {
      bVar2 = Shell_CharNeedsQuotes(*cend,(int)in._M_str);
      if (bVar2) {
        return true;
      }
      cend = cend + 1;
    }
    if ((((undefined1  [16])in & (undefined1  [16])0x100) != (undefined1  [16])0x0) &&
       (sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
       sVar3 == 1)) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,0);
      cVar1 = *pvVar4;
      if ((cVar1 == '?') ||
         ((((cVar1 == '&' || (cVar1 == '^')) || (cVar1 == '|')) || (cVar1 == '#')))) {
        return true;
      }
    }
    if (((((undefined1  [16])in & (undefined1  [16])0x10) == (undefined1  [16])0x0) ||
        (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0)) ||
       ((sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
        sVar3 < 2 ||
        ((pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,0),
         *pvVar4 != '\\' ||
         (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,1),
         *pvVar4 != '\\')))))) {
      in_local._M_str._7_1_ = false;
    }
    else {
      in_local._M_str._7_1_ = true;
    }
  }
  return in_local._M_str._7_1_;
}

Assistant:

bool cmOutputConverter::Shell_ArgumentNeedsQuotes(cm::string_view in,
                                                  int flags)
{
  /* The empty string needs quotes.  */
  if (in.empty()) {
    return true;
  }

  /* Scan the string for characters that require quoting.  */
  for (cm::string_view::iterator cit = in.begin(), cend = in.end();
       cit != cend; ++cit) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      cm::string_view::iterator skip = Shell_SkipMakeVariables(cit, cend);
      if (skip != cit) {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return true;
      }
#else
      /* Skip over the make variable references if any are present.  */
      cit = Shell_SkipMakeVariables(cit, cend);

      /* Stop if we have reached the end of the string.  */
      if (cit == cend) {
        break;
      }
#endif
    }

    /* Check whether this character needs quotes.  */
    if (Shell_CharNeedsQuotes(*cit, flags)) {
      return true;
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if (flags & Shell_Flag_IsUnix && in.size() == 1) {
    char c = in[0];
    if ((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#')) {
      return true;
    }
  }

  /* UNC paths in MinGW Makefiles need quotes.  */
  if ((flags & Shell_Flag_MinGWMake) && (flags & Shell_Flag_Make)) {
    if (in.size() > 1 && in[0] == '\\' && in[1] == '\\') {
      return true;
    }
  }

  return false;
}